

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_involve::statement_involve
          (statement_involve *this,tree_type<cs::token_base_*> *tree,bool is_override,context_t *c,
          token_base *ptr)

{
  token_base *in_RCX;
  byte in_DL;
  statement_base *in_RSI;
  context_t *in_RDI;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffa8;
  
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RCX,in_stack_ffffffffffffffa8);
  statement_base::statement_base(in_RSI,in_RDI,in_RCX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x241924);
  (in_RDI->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__statement_involve_003be188;
  *(byte *)&in_RDI[2].super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_DL & 1;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_RCX,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

statement_involve(tree_type<token_base *> tree, bool is_override, context_t c, token_base *ptr)
			: statement_base(std::move(c), ptr), mOverride(is_override), mTree(std::move(tree)) {}